

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::value::color3f> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::color3f>
          (optional<tinyusdz::value::color3f> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::value::color3f> local_20;
  
  primvar::PrimVar::get_value<tinyusdz::value::color3f>(&local_20,&this->_var);
  __return_storage_ptr__->has_value_ = local_20.has_value_;
  if (local_20.has_value_ == true) {
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_20.contained._8_4_;
    *(undefined8 *)&__return_storage_ptr__->contained = local_20.contained._0_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }